

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

string * __thiscall
cmFindPathCommand::FindFrameworkHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this)

{
  pointer pbVar1;
  string *psVar2;
  size_type sVar3;
  pointer pcVar4;
  string *dir;
  string *n;
  pointer file;
  bool bVar5;
  bool bVar6;
  
  file = (this->super_cmFindBase).Names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = file == pbVar1;
  if (!bVar5) {
    do {
      dir = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = dir == psVar2;
      if (!bVar6) {
        FindHeaderInFramework(__return_storage_ptr__,this,file,dir);
        sVar3 = __return_storage_ptr__->_M_string_length;
        while (sVar3 == 0) {
          dir = dir + 1;
          pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &__return_storage_ptr__->field_2) {
            operator_delete(pcVar4,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
          }
          bVar6 = dir == psVar2;
          if (bVar6) goto LAB_001d4a5b;
          FindHeaderInFramework(__return_storage_ptr__,this,file,dir);
          sVar3 = __return_storage_ptr__->_M_string_length;
        }
        if (!bVar6) {
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          break;
        }
      }
LAB_001d4a5b:
      file = file + 1;
      bVar5 = file == pbVar1;
    } while (!bVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindFrameworkHeader()
{
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      std::string fwPath = this->FindHeaderInFramework(n, sp);
      if (!fwPath.empty()) {
        return fwPath;
      }
    }
  }
  return "";
}